

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O2

void light_room(loc grid,_Bool light)

{
  uint32_t *puVar1;
  player *p;
  _Bool _Var2;
  _Bool _Var3;
  uint32_t uVar4;
  point_set *seen;
  ulong uVar5;
  loc lVar6;
  square *psVar7;
  monster_conflict *mon;
  int iVar8;
  long lVar9;
  long lVar10;
  
  seen = (point_set *)point_set_new(200);
  cave_room_aux(seen,grid);
  for (lVar10 = 0; uVar5 = (ulong)seen->n, lVar10 < (long)uVar5; lVar10 = lVar10 + 1) {
    _Var2 = square_isprojectable(cave,seen->pts[lVar10]);
    if (_Var2) {
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        lVar6 = (loc)loc_sum((loc_conflict)seen->pts[lVar10],(loc_conflict)ddgrid_ddd[lVar9]);
        cave_room_aux(seen,lVar6);
      }
    }
  }
  if (light) {
    for (lVar10 = 0; lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      psVar7 = square(cave,seen->pts[lVar10]);
      flag_on_dbg(psVar7->info,3,2,"square(cave, ps->pts[i])->info","SQUARE_GLOW");
      uVar5 = (ulong)(uint)seen->n;
    }
    for (lVar10 = 0; lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      square_light_spot((chunk *)cave,seen->pts[lVar10]);
      psVar7 = square(cave,seen->pts[lVar10]);
      if (0 < psVar7->mon) {
        mon = (monster_conflict *)square_monster(cave,seen->pts[lVar10]);
        _Var2 = monster_is_stupid((monster *)mon);
        _Var3 = monster_is_smart((monster *)mon);
        if (mon->m_timed[0] != 0) {
          iVar8 = 0x19;
          if (_Var2) {
            iVar8 = 10;
          }
          if (_Var3) {
            iVar8 = 100;
          }
          uVar4 = Rand_div(100);
          if ((int)uVar4 < iVar8) {
            monster_wake(mon,true,L'd');
          }
        }
      }
      uVar5 = (ulong)(uint)seen->n;
    }
  }
  else {
    for (lVar10 = 0; lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      lVar6 = seen->pts[lVar10];
      _Var2 = square_isbright(cave,lVar6);
      if (!_Var2) {
        psVar7 = square(cave,seen->pts[lVar10]);
        flag_off(psVar7->info,3,2);
      }
      _Var2 = flag_has_dbg((player->state).pflags,3,0xc,"player->state.pflags","(PF_UNLIGHT)");
      if (_Var2) {
        square_memorize(cave,lVar6);
      }
      _Var2 = square_isfloor(cave,lVar6);
      if (_Var2) {
        square_forget(cave,lVar6);
      }
      uVar5 = (ulong)(uint)seen->n;
    }
    for (lVar10 = 0; lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
      square_light_spot((chunk *)cave,seen->pts[lVar10]);
      uVar5 = (ulong)(uint)seen->n;
    }
  }
  point_set_dispose((point_set_conflict *)seen);
  p = player;
  puVar1 = &player->upkeep->update;
  *puVar1 = *puVar1 | 0x60;
  update_stuff(p);
  return;
}

Assistant:

void light_room(struct loc grid, bool light)
{
	int i, d;
	struct point_set *ps;

	ps = point_set_new(200);

	/* Add the initial grid */
	cave_room_aux(ps, grid);

	/* While grids are in the queue, add their neighbors */
	for (i = 0; i < ps->n; i++) {
		/* Walls get lit, but stop light */
		if (!square_isprojectable(cave, ps->pts[i])) continue;

		/* Spread to the adjacent grids */
		for (d = 0; d < 8; d++) {
			cave_room_aux(ps, loc_sum(ps->pts[i], ddgrid_ddd[d]));
		}
	}

	/* Now, lighten or darken them all at once */
	if (light) {
		cave_light(ps);
	} else {
		cave_unlight(ps);
	}
	point_set_dispose(ps);

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Update stuff */
	update_stuff(player);
}